

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkBalance(Abc_Ntk_t *pNtk,int fDuplicate,int fSelective,int fUpdateLevel)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  long lVar5;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (fSelective == 0) {
      iVar1 = 0;
    }
    else {
      uVar4 = 0;
      Abc_NtkStartReverseLevels(pNtk,0);
      pVVar2 = pNtk->vObjs;
      if (0 < pVVar2->nSize) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar2->pArray[lVar5];
          if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
            iVar1 = Abc_ObjRequiredLevel(pObj);
            if ((int)(iVar1 - (*(uint *)&pObj->field_0x14 >> 0xc)) < 2) {
              *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x10;
              uVar4 = uVar4 + 1;
            }
          }
          lVar5 = lVar5 + 1;
          pVVar2 = pNtk->vObjs;
        } while (lVar5 < pVVar2->nSize);
      }
      printf("The number of nodes on the critical paths = %6d  (%5.2f %%)\n",
             ((double)(int)uVar4 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar4);
      iVar1 = fSelective;
    }
    pNtkAig = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_NtkBalancePerform(pNtk,pNtkAig,fDuplicate,iVar1,fUpdateLevel);
    Abc_NtkFinalize(pNtk,pNtkAig);
    Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc);
    if (fSelective != 0) {
      Abc_NtkStopReverseLevels(pNtk);
      Abc_NtkCleanMarkA(pNtk);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup(pNtk->pExdc);
      pNtkAig->pExdc = pAVar3;
    }
    iVar1 = Abc_NtkCheck(pNtkAig);
    if (iVar1 == 0) {
      puts("Abc_NtkBalance: The network check has failed.");
      Abc_NtkDelete(pNtkAig);
      pNtkAig = (Abc_Ntk_t *)0x0;
    }
    return pNtkAig;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                ,0x39,"Abc_Ntk_t *Abc_NtkBalance(Abc_Ntk_t *, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBalance( Abc_Ntk_t * pNtk, int fDuplicate, int fSelective, int fUpdateLevel )
{
//    extern void Abc_NtkHaigTranfer( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
    Abc_Ntk_t * pNtkAig;
    assert( Abc_NtkIsStrash(pNtk) );
    // compute the required times
    if ( fSelective )
    {
        Abc_NtkStartReverseLevels( pNtk, 0 );
        Abc_NtkMarkCriticalNodes( pNtk );
    }
    // perform balancing
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer HAIG
//    Abc_NtkHaigTranfer( pNtk, pNtkAig );
    // perform balancing
    Abc_NtkBalancePerform( pNtk, pNtkAig, fDuplicate, fSelective, fUpdateLevel );
    Abc_NtkFinalize( pNtk, pNtkAig );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkAig->pManFunc );
    // undo the required times
    if ( fSelective )
    {
        Abc_NtkStopReverseLevels( pNtk );
        Abc_NtkCleanMarkA( pNtk );
    }
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkBalance: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//Abc_NtkPrintCiLevels( pNtkAig );
    return pNtkAig;
}